

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

Am_Value * __thiscall
Web_Context::Get(Web_Context *this,Am_Object_Advanced *object,Am_Slot_Key key,Am_Slot_Flags flags)

{
  int iVar1;
  undefined4 extraout_var;
  Am_Constraint *new_dependency;
  Am_Slot local_40;
  Am_Slot slot;
  Input_Port *curr;
  Am_Slot_Flags flags_local;
  Am_Slot_Key key_local;
  Am_Object_Advanced *object_local;
  Web_Context *this_local;
  
  if ((flags & 4) == 0) {
    slot.data = (Am_Slot_Data *)Input_Port::Search(this->owner->in_list,object,key);
    if ((Input_Port *)slot.data == (Input_Port *)0x0) {
      local_40 = Am_Object_Advanced::Get_Slot(object,key);
      new_dependency = Am_Web_Data::operator_cast_to_Am_Constraint_(this->owner);
      Am_Slot::Add_Dependency(&local_40,new_dependency);
      Am_Slot::Validate(&local_40);
      this_local = (Web_Context *)Am_Slot::Get(&local_40);
    }
    else {
      Am_Slot::Validate((Am_Slot *)slot.data);
      this_local = (Web_Context *)Am_Slot::Get((Am_Slot *)slot.data);
    }
  }
  else {
    iVar1 = (*Am_Empty_Constraint_Context->_vptr_Am_Constraint_Context[1])
                      (Am_Empty_Constraint_Context,object,(ulong)key,flags);
    this_local = (Web_Context *)CONCAT44(extraout_var,iVar1);
  }
  return (Am_Value *)this_local;
}

Assistant:

const Am_Value &
Web_Context::Get(const Am_Object_Advanced &object, Am_Slot_Key key,
                 Am_Slot_Flags flags)
{
  if (flags & Am_NO_DEPENDENCY)
    return Am_Empty_Constraint_Context->Get(object, key, flags);

  Input_Port *curr = owner->in_list->Search(object, key);
  if (curr) {
    curr->context.Validate();
    return curr->context.Get();
  }
  Am_Slot slot = object.Get_Slot(key);
  slot.Add_Dependency(*owner);
  slot.Validate();
  return slot.Get();
}